

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartTls-Example.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  bool bStop;
  thread thClient;
  thread thServer;
  undefined1 local_31;
  thread local_30;
  thread local_28;
  _Bind<void_(*(bool_*))(const_bool_*)> local_20;
  
  local_31 = 0;
  local_20._M_f = ServerThread;
  local_20._M_bound_args.super__Tuple_impl<0UL,_bool_*>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_bool_*>)(_Tuple_impl<0UL,_bool_*>)&local_31;
  std::thread::thread<std::_Bind<void(*(bool*))(bool_const*)>,,void>(&local_28,&local_20);
  local_20._M_f = (_func_void_bool_ptr *)0x1;
  local_20._M_bound_args.super__Tuple_impl<0UL,_bool_*>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_bool_*>)(_Head_base<0UL,_bool_*,_false>)0x0;
  do {
    iVar1 = nanosleep((timespec *)&local_20,(timespec *)&local_20);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_20._M_f = ClientThread;
  local_20._M_bound_args.super__Tuple_impl<0UL,_bool_*>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_bool_*>)(_Tuple_impl<0UL,_bool_*>)&local_31;
  std::thread::thread<std::_Bind<void(*(bool*))(bool_const*)>,,void>(&local_30,&local_20);
  _getch();
  local_31 = 1;
  std::thread::join();
  std::thread::join();
  if ((local_30._M_id._M_thread == 0) && (local_28._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, const char* argv[])
{
#if defined(_WIN32) || defined(_WIN64)
    // Detect Memory Leaks
    _CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF | _CrtSetDbgFlag(_CRTDBG_REPORT_FLAG));
#endif

    bool bStop = false;
    thread thServer = thread(bind(ServerThread, &bStop));
    // we wait a second that the server is ready
    this_thread::sleep_for(chrono::milliseconds(1000));
    thread thClient = thread(bind(ClientThread, &bStop));

    _getch();

    bStop = true;

    thServer.join();
    thClient.join();

    return 0;
}